

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep_io.c
# Opt level: O3

int LSRKStepSetSTSMethodByName(void *arkode_mem,char *emethod)

{
  int iVar1;
  ARKODE_LSRKMethodType method;
  
  iVar1 = strcmp(emethod,"ARKODE_LSRK_RKC_2");
  if (iVar1 == 0) {
    method = ARKODE_LSRK_RKC_2;
LAB_001478f0:
    iVar1 = LSRKStepSetSTSMethod(arkode_mem,method);
    return iVar1;
  }
  iVar1 = strcmp(emethod,"ARKODE_LSRK_RKL_2");
  if (iVar1 == 0) {
    method = ARKODE_LSRK_RKL_2;
    goto LAB_001478f0;
  }
  iVar1 = strcmp(emethod,"ARKODE_LSRK_SSP_S_2");
  if (iVar1 != 0) {
    iVar1 = strcmp(emethod,"ARKODE_LSRK_SSP_S_3");
    if (iVar1 != 0) {
      iVar1 = strcmp(emethod,"ARKODE_LSRK_SSP_10_4");
      if (iVar1 != 0) goto LAB_001478ac;
    }
  }
  arkProcessError((ARKodeMem)0x0,-0x16,0x9d,"LSRKStepSetSTSMethodByName",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep_io.c"
                  ,"Invalid method option: Call LSRKStepCreateSTS to create an STS method first.");
LAB_001478ac:
  arkProcessError((ARKodeMem)0x0,-0x16,0xa1,"LSRKStepSetSTSMethodByName",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep_io.c"
                  ,"Unknown method type");
  return -0x16;
}

Assistant:

int LSRKStepSetSTSMethodByName(void* arkode_mem, const char* emethod)
{
  if (strcmp(emethod, "ARKODE_LSRK_RKC_2") == 0)
  {
    return LSRKStepSetSTSMethod(arkode_mem, ARKODE_LSRK_RKC_2);
  }
  if (strcmp(emethod, "ARKODE_LSRK_RKL_2") == 0)
  {
    return LSRKStepSetSTSMethod(arkode_mem, ARKODE_LSRK_RKL_2);
  }
  if ((strcmp(emethod, "ARKODE_LSRK_SSP_S_2") == 0) ||
      (strcmp(emethod, "ARKODE_LSRK_SSP_S_3") == 0) ||
      (strcmp(emethod, "ARKODE_LSRK_SSP_10_4") == 0))
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Invalid method option: Call LSRKStepCreateSTS to create an STS method first.");
  }

  arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                  "Unknown method type");

  return ARK_ILL_INPUT;
}